

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_script_arg(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *__return_storage_ptr__,string *arg,string *fname,string *err)

{
  string *str;
  string *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  size_type sVar4;
  bool bVar5;
  uint __val;
  string *psVar6;
  _Alloc_hider _Var7;
  uint uVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  istream *piVar13;
  long *plVar14;
  undefined8 *puVar15;
  uint uVar16;
  undefined8 uVar17;
  size_type *psVar18;
  long *plVar19;
  ulong uVar20;
  pointer pbVar21;
  ulong *puVar22;
  pointer pcVar23;
  undefined1 auVar24 [8];
  uint __val_00;
  ulong uVar25;
  int i_1;
  size_type sVar26;
  uint __len;
  bool bVar27;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 uVar28;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 uVar29;
  undefined1 local_528 [8];
  string val;
  string local_320;
  string local_300;
  string local_2e0;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  long *local_2a0;
  long local_298;
  long local_290;
  undefined4 uStack_288;
  undefined4 uStack_284;
  long *local_280;
  long local_278;
  long local_270;
  undefined4 uStack_268;
  undefined4 uStack_264;
  long *local_260;
  long local_258;
  long local_250;
  undefined4 uStack_248;
  undefined4 uStack_244;
  long *local_240;
  long local_238;
  long local_230;
  undefined4 uStack_228;
  undefined4 uStack_224;
  long *local_220;
  long local_218;
  long local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  long *local_200;
  long local_1f8;
  long local_1f0;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  string local_1c0;
  string local_1a0;
  string local_180;
  ulong local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  undefined1 auStack_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong local_d0;
  undefined1 local_c8 [8];
  string index;
  string line;
  undefined1 local_78 [8];
  string def;
  string element;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(arg->_M_dataplus)._M_p == '\"') {
    readQuote((string *)local_528,arg);
    if (val._M_dataplus._M_p != (pointer)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_528);
    }
    psVar6 = &val;
LAB_0012b3d3:
    puVar3 = (undefined1 *)(&psVar6->_M_string_length)[-2];
    if ((size_type *)puVar3 == &psVar6->_M_string_length) {
      return __return_storage_ptr__;
    }
    operator_delete(puVar3);
    return __return_storage_ptr__;
  }
  lVar12 = std::__cxx11::string::find((char *)arg,0x1354dd,0);
  line.field_2._8_8_ = err;
  if (lVar12 != -1) {
    iVar10 = std::__cxx11::string::find((char *)arg,0x1354dd,0);
    iVar11 = std::__cxx11::string::find((char *)arg,0x135b5c,0);
    std::__cxx11::string::substr((ulong)&local_320,(ulong)arg);
    trimSpaces((string *)local_c8,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    if ((iVar10 + 1 == iVar11) || (index._M_dataplus._M_p == (pointer)0x0)) {
      local_78 = (undefined1  [8])&def._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,*(long *)line.field_2._8_8_,
                 *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
      std::__cxx11::string::append(local_78);
      plVar14 = (long *)std::__cxx11::string::_M_append(local_78,(ulong)(arg->_M_dataplus)._M_p);
      psVar18 = (size_type *)(plVar14 + 2);
      if ((size_type *)*plVar14 == psVar18) {
        val._M_string_length = *psVar18;
        val.field_2._M_allocated_capacity = plVar14[3];
        local_528 = (undefined1  [8])&val._M_string_length;
      }
      else {
        val._M_string_length = *psVar18;
        local_528 = (undefined1  [8])*plVar14;
      }
      val._M_dataplus._M_p = (pointer)plVar14[1];
      *plVar14 = (long)psVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append(local_528);
      plVar19 = plVar14 + 2;
      if ((long *)*plVar14 == plVar19) {
        uVar28 = (undefined4)*plVar19;
        uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
        local_2b0 = *plVar19;
        uStack_2a8 = (undefined4)plVar14[3];
        uStack_2a4 = *(undefined4 *)((long)plVar14 + 0x1c);
        local_2c0 = &local_2b0;
      }
      else {
        local_2b0 = *plVar19;
        uVar28 = extraout_XMM0_Da;
        uVar29 = extraout_XMM0_Db;
        local_2c0 = (long *)*plVar14;
      }
      local_2b8 = plVar14[1];
      *plVar14 = (long)plVar19;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      log((double)CONCAT44(uVar29,uVar28));
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0);
      }
      if (local_528 != (undefined1  [8])&val._M_string_length) {
        operator_delete((void *)local_528);
      }
      if (local_78 != (undefined1  [8])&def._M_string_length) {
        operator_delete((void *)local_78);
      }
      bVar5 = true;
      bVar27 = false;
    }
    else {
      bVar5 = true;
      pcVar23 = (pointer)0x0;
      do {
        bVar5 = (bool)(bVar5 & (int)*(char *)((long)local_c8 + (long)pcVar23) - 0x30U < 10);
        pcVar23 = pcVar23 + 1;
      } while (index._M_dataplus._M_p != pcVar23);
      uVar25 = 0xffffffffffffffff;
      if (bVar5) {
        iVar10 = atoi((char *)local_c8);
        uVar25 = (ulong)iVar10;
      }
      std::__cxx11::string::find((char *)arg,0x1354dd,0);
      element.field_2._8_8_ = __return_storage_ptr__;
      std::__cxx11::string::substr((ulong)local_78,(ulong)arg);
      auStack_118 = (undefined1  [8])0x0;
      arr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::ifstream::ifstream(local_528,(string *)fname,_S_in);
      cVar9 = std::__basic_file<char>::is_open();
      if (cVar9 != '\0') {
        index.field_2._8_8_ = &line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length = line._M_string_length & 0xffffffffffffff00;
        psVar18 = &element._M_string_length;
        local_d0 = 0;
        str = (string *)(index.field_2._M_local_buf + 8);
        psVar6 = (string *)(&def.field_2._M_allocated_capacity + 1);
        local_160 = uVar25;
LAB_0012b580:
        do {
          do {
            cVar9 = std::ios::widen((char)*(undefined8 *)((long)local_528 + -0x18) +
                                    (char)(istream *)local_528);
            piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_528,(string *)str,cVar9);
            if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0)
            goto LAB_0012b934;
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c0,index.field_2._8_8_,
                       line._M_dataplus._M_p + index.field_2._8_8_);
            trimSpaces(psVar6,&local_1c0);
            std::__cxx11::string::operator=((string *)str,(string *)psVar6);
            if ((size_type *)def.field_2._8_8_ != psVar18) {
              operator_delete((void *)def.field_2._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p);
            }
            lVar12 = std::__cxx11::string::find((char *)str,0x1352c2,0);
          } while (lVar12 == 0);
          if ((local_d0 & 1) == 0) {
            lVar12 = std::__cxx11::string::find((char *)str,(ulong)local_78,0);
            if (lVar12 == -1) goto LAB_0012b580;
            std::__cxx11::string::find((char *)str,(ulong)local_78,0);
            std::__cxx11::string::substr((ulong)psVar6,(ulong)str);
            std::__cxx11::string::operator=((string *)str,(string *)psVar6);
            if ((size_type *)def.field_2._8_8_ != psVar18) {
              operator_delete((void *)def.field_2._8_8_);
            }
            lVar12 = std::__cxx11::string::find((char *)str,0x13675b,0);
            if (lVar12 == -1) goto LAB_0012b580;
            std::__cxx11::string::find((char *)str,0x13675b,0);
            std::__cxx11::string::substr((ulong)psVar6,(ulong)str);
            std::__cxx11::string::operator=((string *)str,(string *)psVar6);
            if ((size_type *)def.field_2._8_8_ != psVar18) {
              operator_delete((void *)def.field_2._8_8_);
            }
            uVar17 = 0;
            lVar12 = std::__cxx11::string::find((char *)str,0x13635a,0);
            local_d0 = CONCAT71((int7)((ulong)uVar17 >> 8),1);
            if (lVar12 == -1) {
              std::__cxx11::string::find((char *)str,0x13635a,0);
              std::__cxx11::string::substr((ulong)psVar6,(ulong)str);
              std::__cxx11::string::operator=((string *)str,(string *)psVar6);
              if ((size_type *)def.field_2._8_8_ != psVar18) {
                operator_delete((void *)def.field_2._8_8_);
              }
            }
          }
          lVar12 = std::__cxx11::string::find((char *)str,0x13635a,0);
          if (lVar12 == -1) {
            std::__cxx11::string::find((char *)str,0x13635a,0);
            std::__cxx11::string::substr((ulong)psVar6,(ulong)str);
            std::__cxx11::string::operator=((string *)str,(string *)psVar6);
            if ((size_type *)def.field_2._8_8_ != psVar18) {
              operator_delete((void *)def.field_2._8_8_);
            }
          }
          do {
            readQuote(psVar6,str);
            _Var7 = element._M_dataplus;
            if (element._M_dataplus._M_p != (pointer)0x0) {
              std::__cxx11::string::find((char *)str,0x135972,0);
              std::__cxx11::string::substr((ulong)&local_f0,(ulong)str);
              std::__cxx11::string::operator=((string *)str,(string *)&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              std::__cxx11::string::find((char *)str,0x135972,0);
              std::__cxx11::string::substr((ulong)&local_f0,(ulong)str);
              std::__cxx11::string::operator=((string *)str,(string *)&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              std::__cxx11::string::find((char *)str,0x136700,0);
              std::__cxx11::string::substr((ulong)&local_f0,(ulong)str);
              std::__cxx11::string::operator=((string *)str,(string *)&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_118,psVar6);
            }
            if ((size_type *)def.field_2._8_8_ != psVar18) {
              operator_delete((void *)def.field_2._8_8_);
            }
          } while (_Var7._M_p != (pointer)0x0);
          lVar12 = std::__cxx11::string::find((char *)str,0x1361a9,0);
        } while (lVar12 == -1);
LAB_0012b934:
        uVar25 = local_160;
        if ((size_type *)index.field_2._8_8_ != &line._M_string_length) {
          operator_delete((void *)index.field_2._8_8_);
          uVar25 = local_160;
        }
      }
      std::ifstream::close();
      pbVar21 = arr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar24 = auStack_118;
      lVar12 = (long)arr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_118;
      bVar5 = lVar12 != 0;
      if (lVar12 == 0) {
        def.field_2._8_8_ = &element._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&def.field_2 + 8),*(long *)line.field_2._8_8_,
                   *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
        std::__cxx11::string::append(def.field_2._M_local_buf + 8);
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    (def.field_2._M_local_buf + 8,(ulong)(arg->_M_dataplus)._M_p);
        psVar18 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar18) {
          line._M_string_length = *psVar18;
          line.field_2._M_allocated_capacity = plVar14[3];
          index.field_2._8_8_ = &line._M_string_length;
        }
        else {
          line._M_string_length = *psVar18;
          index.field_2._8_8_ = (size_type *)*plVar14;
        }
        line._M_dataplus._M_p = (pointer)plVar14[1];
        *plVar14 = (long)psVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(index.field_2._M_local_buf + 8);
        plVar19 = plVar14 + 2;
        if ((long *)*plVar14 == plVar19) {
          uVar28 = (undefined4)*plVar19;
          uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
          local_290 = *plVar19;
          uStack_288 = (undefined4)plVar14[3];
          uStack_284 = *(undefined4 *)((long)plVar14 + 0x1c);
          local_2a0 = &local_290;
        }
        else {
          local_290 = *plVar19;
          uVar28 = extraout_XMM0_Da_03;
          uVar29 = extraout_XMM0_Db_03;
          local_2a0 = (long *)*plVar14;
        }
        local_298 = plVar14[1];
        *plVar14 = (long)plVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        log((double)CONCAT44(uVar29,uVar28));
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if ((size_type *)index.field_2._8_8_ != &line._M_string_length) {
          operator_delete((void *)index.field_2._8_8_);
        }
        if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
          operator_delete((void *)def.field_2._8_8_);
        }
      }
      else if (uVar25 < (ulong)(lVar12 >> 5)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)element.field_2._8_8_,(value_type *)((long)auStack_118 + uVar25 * 0x20));
      }
      else {
        lVar12 = 0;
        uVar25 = 0;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)element.field_2._8_8_,(value_type *)((long)auStack_118 + lVar12));
          uVar25 = uVar25 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar25 < (ulong)((long)arr.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                  (long)auStack_118 >> 5));
      }
      bVar27 = (undefined1  [8])pbVar21 == auVar24;
      std::ifstream::~ifstream(local_528);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_118);
      __return_storage_ptr__ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)element.field_2._8_8_;
      if (local_78 != (undefined1  [8])&def._M_string_length) {
        operator_delete((void *)local_78);
        __return_storage_ptr__ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)element.field_2._8_8_;
      }
    }
    if (local_c8 != (undefined1  [8])&index._M_string_length) {
      operator_delete((void *)local_c8);
    }
    if (bVar27 || bVar5) {
      return __return_storage_ptr__;
    }
    goto LAB_0012c75b;
  }
  lVar12 = std::__cxx11::string::find((char *)arg,0x136167,0);
  if ((lVar12 == -1) || (lVar12 = std::__cxx11::string::find((char *)arg,0x135e16,0), lVar12 == -1))
  {
    sVar4 = arg->_M_string_length;
    element.field_2._8_8_ = __return_storage_ptr__;
    if (sVar4 != 0) {
      pcVar23 = (arg->_M_dataplus)._M_p;
      sVar26 = 0;
      do {
        cVar9 = pcVar23[sVar26];
        iVar11 = (int)cVar9;
        iVar10 = isalpha(iVar11);
        if ((((iVar11 != 0x3a) && (cVar9 != '_')) && (iVar10 == 0)) && (9 < iVar11 - 0x30U)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)line.field_2._8_8_,"\t Reason: argument \'");
          __return_storage_ptr__ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)element.field_2._8_8_;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_528,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,arg);
          plVar14 = (long *)std::__cxx11::string::append(local_528);
          plVar19 = plVar14 + 2;
          if ((long *)*plVar14 == plVar19) {
            uVar28 = (undefined4)*plVar19;
            uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
            local_1f0 = *plVar19;
            uStack_1e8 = (undefined4)plVar14[3];
            uStack_1e4 = *(undefined4 *)((long)plVar14 + 0x1c);
            local_200 = &local_1f0;
          }
          else {
            local_1f0 = *plVar19;
            uVar28 = extraout_XMM0_Da_00;
            uVar29 = extraout_XMM0_Db_00;
            local_200 = (long *)*plVar14;
          }
          local_1f8 = plVar14[1];
          *plVar14 = (long)plVar19;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          log((double)CONCAT44(uVar29,uVar28));
          if (local_200 != &local_1f0) {
            operator_delete(local_200);
          }
          if (local_528 != (undefined1  [8])&val._M_string_length) {
            operator_delete((void *)local_528);
          }
          psVar6 = &index;
          goto LAB_0012b3d3;
        }
        sVar26 = sVar26 + 1;
      } while (sVar4 != sVar26);
    }
    lVar12 = std::__cxx11::string::find((char *)arg,0x136884,0);
    if (lVar12 != -1) {
      std::__cxx11::string::find((char *)arg,0x136884,0);
      std::__cxx11::string::substr((ulong)local_528,(ulong)arg);
      std::__cxx11::string::operator=((string *)arg,(string *)local_528);
      if (local_528 != (undefined1  [8])&val._M_string_length) {
        operator_delete((void *)local_528);
      }
    }
    std::ifstream::ifstream((istream *)local_528,(string *)fname,_S_in);
    cVar9 = std::__basic_file<char>::is_open();
    if (cVar9 == '\0') {
LAB_0012c145:
      std::ifstream::close();
      uVar17 = element.field_2._8_8_;
      local_78 = (undefined1  [8])&def._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,*(long *)line.field_2._8_8_,
                 *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
      std::__cxx11::string::append(local_78);
      plVar14 = (long *)std::__cxx11::string::_M_append(local_78,(ulong)(arg->_M_dataplus)._M_p);
      psVar18 = (size_type *)(plVar14 + 2);
      if ((size_type *)*plVar14 == psVar18) {
        index._M_string_length = *psVar18;
        index.field_2._M_allocated_capacity = plVar14[3];
        local_c8 = (undefined1  [8])&index._M_string_length;
      }
      else {
        index._M_string_length = *psVar18;
        local_c8 = (undefined1  [8])*plVar14;
      }
      index._M_dataplus._M_p = (pointer)plVar14[1];
      *plVar14 = (long)psVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append(local_c8);
      plVar19 = plVar14 + 2;
      if ((long *)*plVar14 == plVar19) {
        uVar28 = (undefined4)*plVar19;
        uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
        local_1d0 = *plVar19;
        uStack_1c8 = (undefined4)plVar14[3];
        uStack_1c4 = *(undefined4 *)((long)plVar14 + 0x1c);
        local_1e0 = &local_1d0;
      }
      else {
        local_1d0 = *plVar19;
        uVar28 = extraout_XMM0_Da_01;
        uVar29 = extraout_XMM0_Db_01;
        local_1e0 = (long *)*plVar14;
      }
      local_1d8 = plVar14[1];
      *plVar14 = (long)plVar19;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      log((double)CONCAT44(uVar29,uVar28));
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0);
      }
      if (local_c8 != (undefined1  [8])&index._M_string_length) {
        operator_delete((void *)local_c8);
      }
      auVar24 = local_78;
      if (local_78 == (undefined1  [8])&def._M_string_length) goto LAB_0012c2bf;
    }
    else {
      local_c8 = (undefined1  [8])&index._M_string_length;
      index._M_dataplus._M_p = (pointer)0x0;
      index._M_string_length = index._M_string_length & 0xffffffffffffff00;
      do {
        do {
          do {
            do {
              cVar9 = std::ios::widen((char)*(undefined8 *)((long)local_528 + -0x18) +
                                      (char)(istream *)local_528);
              piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_528,(string *)local_c8,cVar9);
              if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) {
                if (local_c8 != (undefined1  [8])&index._M_string_length) {
                  operator_delete((void *)local_c8);
                }
                goto LAB_0012c145;
              }
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_180,local_c8,index._M_dataplus._M_p + (long)local_c8);
              trimSpaces((string *)local_78,&local_180);
              std::__cxx11::string::operator=((string *)local_c8,(string *)local_78);
              if (local_78 != (undefined1  [8])&def._M_string_length) {
                operator_delete((void *)local_78);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p);
              }
              lVar12 = std::__cxx11::string::find((char *)local_c8,0x1352c2,0);
            } while ((lVar12 == 0) ||
                    (lVar12 = std::__cxx11::string::find
                                        ((char *)local_c8,(ulong)(arg->_M_dataplus)._M_p,0),
                    lVar12 == -1));
            std::__cxx11::string::find((char *)local_c8,(ulong)(arg->_M_dataplus)._M_p,0);
            std::__cxx11::string::substr((ulong)local_78,(ulong)local_c8);
            std::__cxx11::string::operator=((string *)local_c8,(string *)local_78);
            if (local_78 != (undefined1  [8])&def._M_string_length) {
              operator_delete((void *)local_78);
            }
            lVar12 = std::__cxx11::string::find((char *)local_c8,0x13675b,0);
          } while (lVar12 == -1);
          std::__cxx11::string::find((char *)local_c8,0x13675b,0);
          std::__cxx11::string::substr((ulong)local_78,(ulong)local_c8);
          std::__cxx11::string::operator=((string *)local_c8,(string *)local_78);
          if (local_78 != (undefined1  [8])&def._M_string_length) {
            operator_delete((void *)local_78);
          }
          lVar12 = std::__cxx11::string::find((char *)local_c8,0x1361a9,0);
        } while (lVar12 == -1);
        std::__cxx11::string::find((char *)local_c8,0x1361a9,0);
        std::__cxx11::string::substr((ulong)local_78,(ulong)local_c8);
        std::__cxx11::string::operator=((string *)local_c8,(string *)local_78);
        if (local_78 != (undefined1  [8])&def._M_string_length) {
          operator_delete((void *)local_78);
        }
        lVar12 = std::__cxx11::string::find((char *)local_c8,0x135972,0);
      } while (lVar12 == -1);
      std::ifstream::close();
      uVar17 = element.field_2._8_8_;
      readQuote((string *)local_78,(string *)local_c8);
      if (def._M_dataplus._M_p != (pointer)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)uVar17,(value_type *)local_78);
      }
      if (local_78 != (undefined1  [8])&def._M_string_length) {
        operator_delete((void *)local_78);
      }
      auVar24 = local_c8;
      if (local_c8 == (undefined1  [8])&index._M_string_length) goto LAB_0012c2bf;
    }
    operator_delete((void *)auVar24);
LAB_0012c2bf:
    std::ifstream::~ifstream(local_528);
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)uVar17;
  }
  iVar10 = std::__cxx11::string::find((char *)arg,0x136167,0);
  iVar11 = std::__cxx11::string::find((char *)arg,0x135e16,0);
  std::__cxx11::string::substr((ulong)&local_300,(ulong)arg);
  trimSpaces((string *)local_c8,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((iVar10 + 1 == iVar11) || (index._M_dataplus._M_p == (pointer)0x0)) {
    std::__cxx11::string::find((char *)arg,0x136167,0);
    std::__cxx11::string::substr((ulong)local_528,(ulong)arg);
    uVar17 = line.field_2._8_8_;
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_528,0,(char *)0x0,0x1367ba);
    local_78 = (undefined1  [8])&def._M_string_length;
    psVar18 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar18) {
      def._M_string_length = *psVar18;
      def.field_2._M_allocated_capacity = plVar14[3];
    }
    else {
      def._M_string_length = *psVar18;
      local_78 = (undefined1  [8])*plVar14;
    }
    def._M_dataplus._M_p = (pointer)plVar14[1];
    *plVar14 = (long)psVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if (local_528 != (undefined1  [8])&val._M_string_length) {
      operator_delete((void *)local_528);
    }
    std::ifstream::ifstream(local_528,(string *)fname,_S_in);
    cVar9 = std::__basic_file<char>::is_open();
    if (cVar9 == '\0') {
LAB_0012cb60:
      std::ifstream::close();
      def.field_2._8_8_ = &element._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&def.field_2 + 8),*(long *)uVar17,
                 *(long *)(uVar17 + 8) + *(long *)uVar17);
      std::__cxx11::string::append(def.field_2._M_local_buf + 8);
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  (def.field_2._M_local_buf + 8,(ulong)(arg->_M_dataplus)._M_p);
      psVar18 = (size_type *)(plVar14 + 2);
      if ((size_type *)*plVar14 == psVar18) {
        line._M_string_length = *psVar18;
        line.field_2._M_allocated_capacity = plVar14[3];
        index.field_2._8_8_ = &line._M_string_length;
      }
      else {
        line._M_string_length = *psVar18;
        index.field_2._8_8_ = (size_type *)*plVar14;
      }
      line._M_dataplus._M_p = (pointer)plVar14[1];
      *plVar14 = (long)psVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append(index.field_2._M_local_buf + 8);
      plVar19 = plVar14 + 2;
      if ((long *)*plVar14 == plVar19) {
        uVar28 = (undefined4)*plVar19;
        uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
        local_210 = *plVar19;
        uStack_208 = (undefined4)plVar14[3];
        uStack_204 = *(undefined4 *)((long)plVar14 + 0x1c);
        local_220 = &local_210;
      }
      else {
        local_210 = *plVar19;
        uVar28 = extraout_XMM0_Da_05;
        uVar29 = extraout_XMM0_Db_05;
        local_220 = (long *)*plVar14;
      }
      local_218 = plVar14[1];
      *plVar14 = (long)plVar19;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      log((double)CONCAT44(uVar29,uVar28));
      if (local_220 != &local_210) {
        operator_delete(local_220);
      }
      if ((size_type *)index.field_2._8_8_ != &line._M_string_length) {
        operator_delete((void *)index.field_2._8_8_);
      }
      if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
        operator_delete((void *)def.field_2._8_8_);
      }
      bVar27 = true;
    }
    else {
      index.field_2._8_8_ = &line._M_string_length;
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length = line._M_string_length & 0xffffffffffffff00;
      __val_00 = 0;
      this = (string *)(index.field_2._M_local_buf + 8);
      local_d0 = 0;
      element.field_2._8_8_ = __return_storage_ptr__;
      do {
        do {
          cVar9 = std::ios::widen((char)*(undefined8 *)((long)local_528 + -0x18) +
                                  (char)(istream *)local_528);
          piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_528,this,cVar9);
          if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0)
          goto LAB_0012cb32;
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a0,index.field_2._8_8_,
                     line._M_dataplus._M_p + index.field_2._8_8_);
          trimSpaces((string *)(def.field_2._M_local_buf + 8),&local_1a0);
          std::__cxx11::string::operator=(this,(string *)(def.field_2._M_local_buf + 8));
          if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
            operator_delete((void *)def.field_2._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p);
          }
          lVar12 = std::__cxx11::string::find((char *)this,0x1352c2,0);
          __val_00 = __val_00 + 1;
        } while (lVar12 == 0);
        lVar12 = std::__cxx11::string::find((char *)this,(ulong)local_78,0);
        uVar20 = CONCAT71((int7)(local_d0 >> 8),(byte)local_d0 | lVar12 != -1);
        uVar25 = local_d0 & 1;
        local_d0 = uVar20;
      } while ((uVar25 == 0 && lVar12 == -1) ||
              (iVar10 = std::__cxx11::string::find((char *)this,0x1367c2,0), iVar10 == -1));
      std::__cxx11::string::substr
                ((ulong)((long)&def.field_2 + 8),(ulong)((long)&index.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(index.field_2._M_local_buf + 8),(string *)(def.field_2._M_local_buf + 8)
                );
      uVar17 = line.field_2._8_8_;
      if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
        operator_delete((void *)def.field_2._8_8_);
      }
      iVar10 = std::__cxx11::string::find(index.field_2._M_local_buf + 8,0x1361a9,0);
      if (iVar10 == -1) {
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,*(long *)uVar17,*(long *)(uVar17 + 8) + *(long *)uVar17);
        std::__cxx11::string::append((char *)&local_158);
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_158,(ulong)(arg->_M_dataplus)._M_p);
        auStack_118 = (undefined1  [8])
                      &arr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          arr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pbVar21->_M_dataplus)._M_p;
          arr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar14[3];
        }
        else {
          arr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pbVar21->_M_dataplus)._M_p;
          auStack_118 = (undefined1  [8])*plVar14;
        }
        arr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append(auStack_118);
        paVar1 = &local_f0.field_2;
        puVar22 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_f0.field_2._M_allocated_capacity = *puVar22;
          local_f0.field_2._8_8_ = puVar15[3];
          local_f0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *puVar22;
          local_f0._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_f0._M_string_length = puVar15[1];
        *puVar15 = puVar22;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        __val = -__val_00;
        if (0 < (int)__val_00) {
          __val = __val_00;
        }
        __len = 1;
        if (9 < __val) {
          uVar25 = (ulong)__val;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar16 = (uint)uVar25;
            if (uVar16 < 100) {
              __len = __len - 2;
              goto LAB_0012cce2;
            }
            if (uVar16 < 1000) {
              __len = __len - 1;
              goto LAB_0012cce2;
            }
            if (uVar16 < 10000) goto LAB_0012cce2;
            uVar25 = uVar25 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar16);
          __len = __len + 1;
        }
LAB_0012cce2:
        paVar2 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_138,(char)__len - (char)((int)__val_00 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_138._M_dataplus._M_p + (__val_00 >> 0x1f),__len,__val);
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          uVar17 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_138._M_string_length + local_f0._M_string_length) {
          uVar17 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar2) {
            uVar17 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_138._M_string_length + local_f0._M_string_length)
          goto LAB_0012cd66;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_138,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
        }
        else {
LAB_0012cd66:
          puVar15 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_f0,(ulong)local_138._M_dataplus._M_p);
        }
        def.field_2._8_8_ = &element._M_string_length;
        psVar18 = puVar15 + 2;
        if ((size_type *)*puVar15 == psVar18) {
          element._M_string_length = *psVar18;
          element.field_2._M_allocated_capacity = puVar15[3];
        }
        else {
          element._M_string_length = *psVar18;
          def.field_2._8_8_ = (size_type *)*puVar15;
        }
        element._M_dataplus._M_p = (pointer)puVar15[1];
        *puVar15 = psVar18;
        puVar15[1] = 0;
        *(undefined1 *)psVar18 = 0;
        plVar14 = (long *)std::__cxx11::string::append(def.field_2._M_local_buf + 8);
        plVar19 = plVar14 + 2;
        if ((long *)*plVar14 == plVar19) {
          uVar28 = (undefined4)*plVar19;
          uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
          local_250 = *plVar19;
          uStack_248 = (undefined4)plVar14[3];
          uStack_244 = *(undefined4 *)((long)plVar14 + 0x1c);
          local_260 = &local_250;
        }
        else {
          local_250 = *plVar19;
          uVar28 = extraout_XMM0_Da_06;
          uVar29 = extraout_XMM0_Db_06;
          local_260 = (long *)*plVar14;
        }
        local_258 = plVar14[1];
        *plVar14 = (long)plVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        log((double)CONCAT44(uVar29,uVar28));
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        uVar17 = line.field_2._8_8_;
        if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
          operator_delete((void *)def.field_2._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        bVar5 = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        __return_storage_ptr__ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)element.field_2._8_8_;
        if (auStack_118 !=
            (undefined1  [8])
            &arr.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)auStack_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        bVar27 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_2e0,(ulong)((long)&index.field_2 + 8));
        trimSpaces((string *)((long)&def.field_2 + 8),&local_2e0);
        std::__cxx11::string::operator=
                  ((string *)(index.field_2._M_local_buf + 8),
                   (string *)(def.field_2._M_local_buf + 8));
        if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
          operator_delete((void *)def.field_2._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        lVar12 = std::__cxx11::string::find(index.field_2._M_local_buf + 8,0x135972,0);
        if (lVar12 == -1) {
          std::operator+(&local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar17
                         ,"\t Reason: Failed to parse return value for \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_118,&local_158,arg);
          plVar14 = (long *)std::__cxx11::string::append(auStack_118);
          puVar22 = (ulong *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_f0.field_2._M_allocated_capacity = *puVar22;
            local_f0.field_2._8_8_ = plVar14[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *puVar22;
            local_f0._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_f0._M_string_length = plVar14[1];
          *plVar14 = (long)puVar22;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::__cxx11::to_string(&local_138,__val_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&def.field_2 + 8),&local_f0,&local_138);
          plVar14 = (long *)std::__cxx11::string::append(def.field_2._M_local_buf + 8);
          plVar19 = plVar14 + 2;
          if ((long *)*plVar14 == plVar19) {
            uVar28 = (undefined4)*plVar19;
            uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
            local_230 = *plVar19;
            uStack_228 = (undefined4)plVar14[3];
            uStack_224 = *(undefined4 *)((long)plVar14 + 0x1c);
            local_240 = &local_230;
          }
          else {
            local_230 = *plVar19;
            uVar28 = extraout_XMM0_Da_04;
            uVar29 = extraout_XMM0_Db_04;
            local_240 = (long *)*plVar14;
          }
          local_238 = plVar14[1];
          *plVar14 = (long)plVar19;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          log((double)CONCAT44(uVar29,uVar28));
          if (local_240 != &local_230) {
            operator_delete(local_240);
          }
          if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
            operator_delete((void *)def.field_2._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (auStack_118 !=
              (undefined1  [8])
              &arr.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
            operator_delete((void *)auStack_118);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
LAB_0012cb32:
          bVar27 = false;
          bVar5 = true;
          __return_storage_ptr__ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)element.field_2._8_8_;
          uVar17 = line.field_2._8_8_;
        }
        else {
          std::ifstream::close();
          readQuote((string *)((long)&def.field_2 + 8),(string *)((long)&index.field_2 + 8));
          if (element._M_dataplus._M_p != (pointer)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)element.field_2._8_8_,(value_type *)((long)&def.field_2 + 8));
          }
          if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
            operator_delete((void *)def.field_2._8_8_);
          }
          bVar27 = true;
          bVar5 = false;
          __return_storage_ptr__ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)element.field_2._8_8_;
          uVar17 = line.field_2._8_8_;
        }
      }
      if ((size_type *)index.field_2._8_8_ != &line._M_string_length) {
        operator_delete((void *)index.field_2._8_8_);
      }
      if (bVar5) goto LAB_0012cb60;
    }
    std::ifstream::~ifstream(local_528);
    if (local_78 != (undefined1  [8])&def._M_string_length) {
      operator_delete((void *)local_78);
    }
  }
  else {
    local_78 = (undefined1  [8])&def._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,*(long *)line.field_2._8_8_,
               *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
    std::__cxx11::string::append(local_78);
    plVar14 = (long *)std::__cxx11::string::_M_append(local_78,(ulong)(arg->_M_dataplus)._M_p);
    psVar18 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar18) {
      val._M_string_length = *psVar18;
      val.field_2._M_allocated_capacity = plVar14[3];
      local_528 = (undefined1  [8])&val._M_string_length;
    }
    else {
      val._M_string_length = *psVar18;
      local_528 = (undefined1  [8])*plVar14;
    }
    val._M_dataplus._M_p = (pointer)plVar14[1];
    *plVar14 = (long)psVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append(local_528);
    plVar19 = plVar14 + 2;
    if ((long *)*plVar14 == plVar19) {
      uVar28 = (undefined4)*plVar19;
      uVar29 = *(undefined4 *)((long)plVar14 + 0x14);
      local_270 = *plVar19;
      uStack_268 = (undefined4)plVar14[3];
      uStack_264 = *(undefined4 *)((long)plVar14 + 0x1c);
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar19;
      uVar28 = extraout_XMM0_Da_02;
      uVar29 = extraout_XMM0_Db_02;
      local_280 = (long *)*plVar14;
    }
    local_278 = plVar14[1];
    *plVar14 = (long)plVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    log((double)CONCAT44(uVar29,uVar28));
    if (local_280 != &local_270) {
      operator_delete(local_280);
    }
    if (local_528 != (undefined1  [8])&val._M_string_length) {
      operator_delete((void *)local_528);
    }
    if (local_78 != (undefined1  [8])&def._M_string_length) {
      operator_delete((void *)local_78);
    }
    bVar27 = true;
  }
  if (local_c8 != (undefined1  [8])&index._M_string_length) {
    operator_delete((void *)local_c8);
  }
  if (bVar27) {
    return __return_storage_ptr__;
  }
LAB_0012c75b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

vector<string> parse_script_arg(string arg, string fname, string err)
{
	vector<string> ret;

	// parse weapon name from argument 1
	if (arg[0] == '"')
	{
		// It's a string. Easy!
		string val = readQuote(arg);
		if (val.length())
			ret.push_back(val);
		return ret;
	}
	else if (arg.find("[") != string::npos)
	{
		// an index into an array
		int open = arg.find("[");
		int close = arg.find("]");
		string index = trimSpaces(arg.substr(open, close));
		if (close == open+1 || index.length() == 0)
		{
			log(err + "\t Reason: array index couldn't be parsed from '" + arg + "'\n");
			return ret;
		}
		
		bool isNumber = true;
		int idx = -1;
		for (int i = 0; i < index.size(); i++)
			if (!isdigit(index[i]))
				isNumber = false;
		if (isNumber)
			idx = atoi(index.c_str());
		
		// Parse file for array definition
		string def = arg.substr(0, arg.find("["));
		vector<string> arr;
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_array = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (!in_array)
				{
					if (line.find(def) == string::npos)
						continue;
					line = line.substr(line.find(def) + def.length());

					if (line.find("=") == string::npos)
						continue;
					line = line.substr(line.find("=") + 1);

					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					in_array = true;
				}
				if (in_array)
				{
					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					bool hasQuote = true;
					while(hasQuote)
					{
						string element = readQuote(line);
						if (element.length())
						{
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find(",") + 1);
							arr.push_back(element);
						}
						else
							break;
					}

					if (line.find(";") != string::npos)
						break;
				}
				
			}
		}
		file.close();

		if (arr.size() > 0)
		{
			if (idx >= arr.size())
			{
				for (int i = 0; i < arr.size(); i++)
					ret.push_back(arr[i]);
				return ret;
			}
			else
			{
				ret.push_back(arr[idx]);
				return ret;
			}
		}

		log(err + "\t Reason: Failed to parse array definition for '" + arg + "\n");
	}
	else if (arg.find("(") != string::npos && arg.find(")") != string::npos)
	{
		// Uh oh. It's a function
		int open = arg.find("(");
		int close = arg.find(")");
		string params = trimSpaces(arg.substr(open, close));
		if (close != open+1 && params.length())
		{
			log(err + "\t Reason: function call '" + arg + "' has parameters\n");
			return ret;
		}
					
		string funcdef = "string " + arg.substr(0, arg.find("(") + 1);

		// Parse file for function definition
		// anything more complicated than { return "weapon_super"; } won't work
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_func_body = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(funcdef) != string::npos)
					in_func_body = true;

				if (in_func_body)
				{
					int iret = line.find("return ");
					if (iret != string::npos)
					{
						line = line.substr(iret);
						int semi = line.find(";");
						if (semi == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						line = trimSpaces(line.substr(0, semi));
						if (line.find("\"") == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						file.close();

						string val = readQuote(line);
						if (val.length())
							ret.push_back(val);
						return ret;
					}
				}
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse function definition for '" + arg + "\n");
		return ret;
	}
	else // must be a variable
	{
		bool valid_var_name = true;
		for (int i = 0; i < arg.length(); i++)
		{
			if (!isalpha(arg[i]) && !isdigit(arg[i]) && arg[i] != '_' && arg[i] != ':')
			{
				valid_var_name = false;
				break;
			}
		}
		if (!valid_var_name)
		{
			log(err + "\t Reason: argument '" + arg + "' does not appear to be a string, variable, or function\n");
			return ret;
		}
		
		// Strip namespace from the variable name.
		// This will break if there's a different var with the same name assigned in the same file.
		// Ideally all scripts should be searched and the namespace should only be removed when
		// inside the namespace block. Anyway this is good enough for ressya_no_tabi.
		if (arg.find("::") != string::npos) {
			arg = arg.substr(arg.find("::")+2);
		}

		// Parse file for variable assignment
		// ...hopefully it's a global assigned at the top of the file
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(arg) == string::npos)
					continue;
				line = line.substr(line.find(arg) + arg.length());

				if (line.find("=") == string::npos)
					continue;
				line = line.substr(line.find("=") + 1);

				if (line.find(";") == string::npos)
					continue;
				line = line.substr(0, line.find(";"));

				if (line.find("\"") == string::npos)
					continue;

				file.close();

				string val = readQuote(line);
				if (val.length())
					ret.push_back(val);
				return ret;
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse variable assignment for '" + arg + "\n");
	}

	return ret;
}